

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash_ssse3.c
# Opt level: O0

uint64_t siphash13(uchar *key,uchar *m,size_t len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  ulong in_RDX;
  long in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar40 [16];
  xmmi v02;
  xmmi k;
  ulong local_d70;
  ulong local_d60;
  undefined1 local_d58 [16];
  undefined1 local_d28 [16];
  ulong local_d18;
  ulong uStack_d10;
  undefined1 local_d08 [16];
  ulong local_cc8;
  ulong uStack_cc0;
  ulong local_bc8;
  ulong uStack_bc0;
  ulong local_b48;
  ulong uStack_b40;
  ulong local_ac8;
  ulong uStack_ac0;
  ulong local_aa8;
  ulong uStack_aa0;
  ulong local_a88;
  ulong uStack_a80;
  size_t blocks;
  size_t i;
  uint32_t hi;
  uint32_t lo;
  uint64_t last7;
  xmmi mi;
  xmmi v33;
  xmmi v11;
  xmmi v13;
  xmmi v20;
  
  local_d08._0_8_ = siphash_init[0].u[0];
  local_d08._8_8_ = siphash_init[0].u[1];
  auVar40 = vpunpcklqdq_avx(*in_RDI,*in_RDI);
  local_a88 = auVar40._0_8_;
  uStack_a80 = auVar40._8_8_;
  local_d08._0_8_ = local_d08._0_8_ ^ local_a88;
  local_d08._8_8_ = local_d08._8_8_ ^ uStack_a80;
  local_d28._0_8_ = siphash_init[1].u[0];
  local_d28._8_8_ = siphash_init[1].u[1];
  auVar40 = vpunpckhqdq_avx(*in_RDI,*in_RDI);
  local_aa8 = auVar40._0_8_;
  uStack_aa0 = auVar40._8_8_;
  local_d28._0_8_ = local_d28._0_8_ ^ local_aa8;
  local_d28._8_8_ = local_d28._8_8_ ^ uStack_aa0;
  local_d60 = in_RDX << 0x38;
  for (local_d70 = 0; local_d70 < (in_RDX & 0xfffffffffffffff8); local_d70 = local_d70 + 8) {
    local_d58._8_8_ = 0;
    local_d58._0_8_ = *(ulong *)(in_RSI + local_d70);
    auVar40 = vpslldq_avx(local_d58,8);
    local_ac8 = auVar40._0_8_;
    uStack_ac0 = auVar40._8_8_;
    local_d28._0_8_ = local_d28._0_8_ ^ local_ac8;
    local_d28._8_8_ = local_d28._8_8_ ^ uStack_ac0;
    auVar40._8_8_ = local_d28._8_8_;
    auVar40._0_8_ = local_d28._0_8_;
    auVar40 = vpsllq_avx(auVar40,ZEXT416(0xd));
    auVar1._8_8_ = local_d28._8_8_;
    auVar1._0_8_ = local_d28._0_8_;
    auVar2 = vpsrlq_avx(auVar1,ZEXT416(0x33));
    auVar2 = vpor_avx(auVar40,auVar2);
    auVar32._8_8_ = local_d08._8_8_;
    auVar32._0_8_ = local_d08._0_8_;
    auVar31._8_8_ = local_d28._8_8_;
    auVar31._0_8_ = local_d28._0_8_;
    auVar40 = vpaddq_avx(auVar32,auVar31);
    auVar37._8_8_ = local_d28._8_8_;
    auVar37._0_8_ = local_d28._0_8_;
    auVar1 = vpshufb_avx(auVar37,(undefined1  [16])siphash_rot16v3);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    local_d28._0_8_ = auVar2._0_8_;
    local_d28._8_8_ = auVar2._8_8_;
    local_d08._0_8_ = auVar40._0_8_;
    local_d08._8_8_ = auVar40._8_8_;
    local_d28._0_8_ = local_d28._0_8_ ^ local_d08._0_8_;
    local_d28._8_8_ = local_d28._8_8_ ^ local_d08._8_8_;
    auVar40 = vpshufd_avx(auVar40,0x1e);
    auVar1 = vpshufd_avx(local_d28,0x4e);
    auVar2._8_8_ = local_d28._8_8_;
    auVar2._0_8_ = local_d28._0_8_;
    auVar2 = vpsllq_avx(auVar2,ZEXT416(0x11));
    auVar3._8_8_ = local_d28._8_8_;
    auVar3._0_8_ = local_d28._0_8_;
    auVar3 = vpsrlq_avx(auVar3,ZEXT416(0x2f));
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar4._8_8_ = local_d28._8_8_;
    auVar4._0_8_ = local_d28._0_8_;
    auVar40 = vpaddq_avx(auVar40,auVar4);
    auVar3 = vpsllq_avx(auVar1,ZEXT416(0x15));
    auVar1 = vpsrlq_avx(auVar1,ZEXT416(0x2b));
    auVar1 = vpor_avx(auVar3,auVar1);
    vpunpcklqdq_avx(auVar2,auVar1);
    auVar1 = vpunpcklqdq_avx(auVar2,auVar1);
    auVar2 = vpshufd_avx(auVar40,0x1e);
    local_d28._0_8_ = auVar1._0_8_;
    local_d28._8_8_ = auVar1._8_8_;
    local_d18 = auVar40._0_8_;
    uStack_d10 = auVar40._8_8_;
    local_d28._0_8_ = local_d28._0_8_ ^ local_d18;
    local_d28._8_8_ = local_d28._8_8_ ^ uStack_d10;
    local_d08._0_8_ = auVar2._0_8_;
    local_d08._8_8_ = auVar2._8_8_;
    local_d08._0_8_ = local_d08._0_8_ ^ *(ulong *)(in_RSI + local_d70);
  }
  switch(in_RDX - (in_RDX & 0xfffffffffffffff8)) {
  case 7:
    local_d60 = (ulong)*(byte *)(in_RSI + 6 + local_d70) << 0x30 | local_d60;
  case 6:
    local_d60 = (ulong)*(byte *)(in_RSI + 5 + local_d70) << 0x28 | local_d60;
  case 5:
    local_d60 = (ulong)*(byte *)(in_RSI + 4 + local_d70) << 0x20 | local_d60;
  case 4:
    local_d60 = (ulong)*(byte *)(in_RSI + 3 + local_d70) << 0x18 | local_d60;
  case 3:
    local_d60 = (ulong)*(byte *)(in_RSI + 2 + local_d70) << 0x10 | local_d60;
  case 2:
    local_d60 = (ulong)*(byte *)(in_RSI + 1 + local_d70) << 8 | local_d60;
  case 1:
    local_d60 = *(byte *)(in_RSI + local_d70) | local_d60;
  case 0:
  default:
    i = local_d60 & 0xffffffff;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = i;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_d60 >> 0x20;
    auVar4 = vpunpckldq_avx(auVar39,auVar38);
    auVar40 = vpslldq_avx(auVar4,8);
    local_b48 = auVar40._0_8_;
    uStack_b40 = auVar40._8_8_;
    local_d28._0_8_ = local_d28._0_8_ ^ local_b48;
    local_d28._8_8_ = local_d28._8_8_ ^ uStack_b40;
    auVar12._8_8_ = local_d28._8_8_;
    auVar12._0_8_ = local_d28._0_8_;
    auVar40 = vpsllq_avx(auVar12,ZEXT416(0xd));
    auVar20._8_8_ = local_d28._8_8_;
    auVar20._0_8_ = local_d28._0_8_;
    auVar2 = vpsrlq_avx(auVar20,ZEXT416(0x33));
    auVar2 = vpor_avx(auVar40,auVar2);
    auVar30._8_8_ = local_d08._8_8_;
    auVar30._0_8_ = local_d08._0_8_;
    auVar29._8_8_ = local_d28._8_8_;
    auVar29._0_8_ = local_d28._0_8_;
    auVar40 = vpaddq_avx(auVar30,auVar29);
    auVar36._8_8_ = local_d28._8_8_;
    auVar36._0_8_ = local_d28._0_8_;
    auVar1 = vpshufb_avx(auVar36,(undefined1  [16])siphash_rot16v3);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    local_d28._0_8_ = auVar2._0_8_;
    local_d28._8_8_ = auVar2._8_8_;
    local_d08._0_8_ = auVar40._0_8_;
    local_d08._8_8_ = auVar40._8_8_;
    local_d28._0_8_ = local_d28._0_8_ ^ local_d08._0_8_;
    local_d28._8_8_ = local_d28._8_8_ ^ local_d08._8_8_;
    auVar40 = vpshufd_avx(auVar40,0x1e);
    auVar1 = vpshufd_avx(local_d28,0x4e);
    auVar11._8_8_ = local_d28._8_8_;
    auVar11._0_8_ = local_d28._0_8_;
    auVar2 = vpsllq_avx(auVar11,ZEXT416(0x11));
    auVar19._8_8_ = local_d28._8_8_;
    auVar19._0_8_ = local_d28._0_8_;
    auVar3 = vpsrlq_avx(auVar19,ZEXT416(0x2f));
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar28._8_8_ = local_d28._8_8_;
    auVar28._0_8_ = local_d28._0_8_;
    auVar40 = vpaddq_avx(auVar40,auVar28);
    auVar3 = vpsllq_avx(auVar1,ZEXT416(0x15));
    auVar1 = vpsrlq_avx(auVar1,ZEXT416(0x2b));
    auVar1 = vpor_avx(auVar3,auVar1);
    vpunpcklqdq_avx(auVar2,auVar1);
    auVar1 = vpunpcklqdq_avx(auVar2,auVar1);
    auVar2 = vpshufd_avx(auVar40,0x1e);
    local_d28._0_8_ = auVar1._0_8_;
    local_d28._8_8_ = auVar1._8_8_;
    local_d18 = auVar40._0_8_;
    uStack_d10 = auVar40._8_8_;
    local_d28._0_8_ = local_d28._0_8_ ^ local_d18;
    local_d28._8_8_ = local_d28._8_8_ ^ uStack_d10;
    local_d08._0_8_ = auVar2._0_8_;
    local_d08._8_8_ = auVar2._8_8_;
    local_d58._0_8_ = auVar4._0_8_;
    local_d58._8_8_ = auVar4._8_8_;
    local_bc8 = siphash_final.u[0];
    uStack_bc0 = siphash_final.u[1];
    auVar10._8_8_ = local_d28._8_8_;
    auVar10._0_8_ = local_d28._0_8_;
    auVar40 = vpsllq_avx(auVar10,ZEXT416(0xd));
    auVar18._8_8_ = local_d28._8_8_;
    auVar18._0_8_ = local_d28._0_8_;
    auVar2 = vpsrlq_avx(auVar18,ZEXT416(0x33));
    auVar2 = vpor_avx(auVar40,auVar2);
    auVar27._8_8_ = local_d08._8_8_ ^ local_d58._8_8_ ^ uStack_bc0;
    auVar27._0_8_ = local_d08._0_8_ ^ local_d58._0_8_ ^ local_bc8;
    auVar26._8_8_ = local_d28._8_8_;
    auVar26._0_8_ = local_d28._0_8_;
    auVar40 = vpaddq_avx(auVar27,auVar26);
    auVar35._8_8_ = local_d28._8_8_;
    auVar35._0_8_ = local_d28._0_8_;
    auVar1 = vpshufb_avx(auVar35,(undefined1  [16])siphash_rot16v3);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    local_d28._0_8_ = auVar2._0_8_;
    local_d28._8_8_ = auVar2._8_8_;
    local_d08._0_8_ = auVar40._0_8_;
    local_d08._8_8_ = auVar40._8_8_;
    local_d28._0_8_ = local_d28._0_8_ ^ local_d08._0_8_;
    local_d28._8_8_ = local_d28._8_8_ ^ local_d08._8_8_;
    auVar40 = vpshufd_avx(auVar40,0x1e);
    auVar1 = vpshufd_avx(local_d28,0x4e);
    auVar9._8_8_ = local_d28._8_8_;
    auVar9._0_8_ = local_d28._0_8_;
    auVar2 = vpsllq_avx(auVar9,ZEXT416(0x11));
    auVar17._8_8_ = local_d28._8_8_;
    auVar17._0_8_ = local_d28._0_8_;
    auVar3 = vpsrlq_avx(auVar17,ZEXT416(0x2f));
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar25._8_8_ = local_d28._8_8_;
    auVar25._0_8_ = local_d28._0_8_;
    auVar40 = vpaddq_avx(auVar40,auVar25);
    auVar3 = vpsllq_avx(auVar1,ZEXT416(0x15));
    auVar1 = vpsrlq_avx(auVar1,ZEXT416(0x2b));
    auVar1 = vpor_avx(auVar3,auVar1);
    vpunpcklqdq_avx(auVar2,auVar1);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    auVar1 = vpshufd_avx(auVar40,0x1e);
    local_d28._0_8_ = auVar2._0_8_;
    local_d28._8_8_ = auVar2._8_8_;
    local_d18 = auVar40._0_8_;
    uStack_d10 = auVar40._8_8_;
    local_d28._0_8_ = local_d28._0_8_ ^ local_d18;
    local_d28._8_8_ = local_d28._8_8_ ^ uStack_d10;
    auVar8._8_8_ = local_d28._8_8_;
    auVar8._0_8_ = local_d28._0_8_;
    auVar40 = vpsllq_avx(auVar8,ZEXT416(0xd));
    auVar16._8_8_ = local_d28._8_8_;
    auVar16._0_8_ = local_d28._0_8_;
    auVar2 = vpsrlq_avx(auVar16,ZEXT416(0x33));
    auVar2 = vpor_avx(auVar40,auVar2);
    auVar24._8_8_ = local_d28._8_8_;
    auVar24._0_8_ = local_d28._0_8_;
    auVar40 = vpaddq_avx(auVar1,auVar24);
    auVar34._8_8_ = local_d28._8_8_;
    auVar34._0_8_ = local_d28._0_8_;
    auVar1 = vpshufb_avx(auVar34,(undefined1  [16])siphash_rot16v3);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    local_d28._0_8_ = auVar2._0_8_;
    local_d28._8_8_ = auVar2._8_8_;
    local_d08._0_8_ = auVar40._0_8_;
    local_d08._8_8_ = auVar40._8_8_;
    local_d28._0_8_ = local_d28._0_8_ ^ local_d08._0_8_;
    local_d28._8_8_ = local_d28._8_8_ ^ local_d08._8_8_;
    auVar40 = vpshufd_avx(auVar40,0x1e);
    auVar1 = vpshufd_avx(local_d28,0x4e);
    auVar7._8_8_ = local_d28._8_8_;
    auVar7._0_8_ = local_d28._0_8_;
    auVar2 = vpsllq_avx(auVar7,ZEXT416(0x11));
    auVar15._8_8_ = local_d28._8_8_;
    auVar15._0_8_ = local_d28._0_8_;
    auVar3 = vpsrlq_avx(auVar15,ZEXT416(0x2f));
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar23._8_8_ = local_d28._8_8_;
    auVar23._0_8_ = local_d28._0_8_;
    auVar40 = vpaddq_avx(auVar40,auVar23);
    auVar3 = vpsllq_avx(auVar1,ZEXT416(0x15));
    auVar1 = vpsrlq_avx(auVar1,ZEXT416(0x2b));
    auVar1 = vpor_avx(auVar3,auVar1);
    vpunpcklqdq_avx(auVar2,auVar1);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    auVar1 = vpshufd_avx(auVar40,0x1e);
    local_d28._0_8_ = auVar2._0_8_;
    local_d28._8_8_ = auVar2._8_8_;
    local_d18 = auVar40._0_8_;
    uStack_d10 = auVar40._8_8_;
    local_d28._0_8_ = local_d28._0_8_ ^ local_d18;
    local_d28._8_8_ = local_d28._8_8_ ^ uStack_d10;
    auVar6._8_8_ = local_d28._8_8_;
    auVar6._0_8_ = local_d28._0_8_;
    auVar40 = vpsllq_avx(auVar6,ZEXT416(0xd));
    auVar14._8_8_ = local_d28._8_8_;
    auVar14._0_8_ = local_d28._0_8_;
    auVar2 = vpsrlq_avx(auVar14,ZEXT416(0x33));
    auVar2 = vpor_avx(auVar40,auVar2);
    auVar22._8_8_ = local_d28._8_8_;
    auVar22._0_8_ = local_d28._0_8_;
    auVar40 = vpaddq_avx(auVar1,auVar22);
    auVar33._8_8_ = local_d28._8_8_;
    auVar33._0_8_ = local_d28._0_8_;
    auVar1 = vpshufb_avx(auVar33,(undefined1  [16])siphash_rot16v3);
    auVar2 = vpunpcklqdq_avx(auVar2,auVar1);
    local_d28._0_8_ = auVar2._0_8_;
    local_d28._8_8_ = auVar2._8_8_;
    local_d08._0_8_ = auVar40._0_8_;
    local_d08._8_8_ = auVar40._8_8_;
    local_d28._0_8_ = local_d28._0_8_ ^ local_d08._0_8_;
    local_d28._8_8_ = local_d28._8_8_ ^ local_d08._8_8_;
    auVar40 = vpshufd_avx(auVar40,0x1e);
    auVar1 = vpshufd_avx(local_d28,0x4e);
    auVar5._8_8_ = local_d28._8_8_;
    auVar5._0_8_ = local_d28._0_8_;
    auVar2 = vpsllq_avx(auVar5,ZEXT416(0x11));
    auVar13._8_8_ = local_d28._8_8_;
    auVar13._0_8_ = local_d28._0_8_;
    auVar3 = vpsrlq_avx(auVar13,ZEXT416(0x2f));
    auVar2 = vpor_avx(auVar2,auVar3);
    auVar21._8_8_ = local_d28._8_8_;
    auVar21._0_8_ = local_d28._0_8_;
    auVar40 = vpaddq_avx(auVar40,auVar21);
    auVar3 = vpsllq_avx(auVar1,ZEXT416(0x15));
    auVar1 = vpsrlq_avx(auVar1,ZEXT416(0x2b));
    auVar1 = vpor_avx(auVar3,auVar1);
    vpunpcklqdq_avx(auVar2,auVar1);
    auVar1 = vpunpcklqdq_avx(auVar2,auVar1);
    auVar2 = vpshufd_avx(auVar40,0x1e);
    local_d28._0_8_ = auVar1._0_8_;
    local_d28._8_8_ = auVar1._8_8_;
    local_d18 = auVar40._0_8_;
    uStack_d10 = auVar40._8_8_;
    local_d08._0_8_ = auVar2._0_8_;
    local_d08._8_8_ = auVar2._8_8_;
    local_d08._0_8_ = local_d08._0_8_ ^ local_d28._0_8_ ^ local_d18;
    local_d08._8_8_ = local_d08._8_8_ ^ local_d28._8_8_ ^ uStack_d10;
    auVar40 = vpshufd_avx(local_d08,0x4e);
    local_cc8 = auVar40._0_8_;
    uStack_cc0 = auVar40._8_8_;
    local_d08._0_8_ = local_d08._0_8_ ^ local_cc8;
    local_d08._8_8_ = local_d08._8_8_ ^ uStack_cc0;
    v11[1]._0_4_ = (undefined4)local_d08._0_8_;
    auVar40 = vpsrldq_avx(local_d08,4);
    mi[1]._0_4_ = auVar40._0_4_;
    return CONCAT44((undefined4)mi[1],(undefined4)v11[1]);
  }
}

Assistant:

uint64_t
siphash13(const unsigned char key[16], const unsigned char *m, size_t len) {
	xmmi k,v02,v20,v13,v11,v33,mi;
	uint64_t last7;
	uint32_t lo, hi;
	size_t i, blocks;

	k = _mm_loadu_si128((xmmi *)(key + 0));
	v02 = siphash_init[0].v;
	v13 = siphash_init[1].v;
	v02 = _mm_xor_si128(v02, _mm_unpacklo_epi64(k, k));
	v13 = _mm_xor_si128(v13, _mm_unpackhi_epi64(k, k));

	last7 = (uint64_t)(len & 0xff) << 56;

	for (i = 0, blocks = (len & ~7); i < blocks; i += 8) {
		mi = _mm_loadl_epi64((xmmi *)(m + i));
		v13 = _mm_xor_si128(v13, _mm_slli_si128(mi, 8));
		sipcompress()
		v02 = _mm_xor_si128(v02, mi);
	}

	switch (len - blocks) {
		case 7: last7 |= (uint64_t)m[i + 6] << 48;
		case 6: last7 |= (uint64_t)m[i + 5] << 40;
		case 5: last7 |= (uint64_t)m[i + 4] << 32;
		case 4: last7 |= (uint64_t)m[i + 3] << 24;
		case 3: last7 |= (uint64_t)m[i + 2] << 16;
		case 2: last7 |= (uint64_t)m[i + 1] <<  8;
		case 1: last7 |= (uint64_t)m[i + 0]      ;
		case 0:
		default:;
	};

	mi = _mm_unpacklo_epi32(_mm_cvtsi32_si128((uint32_t)last7),_mm_cvtsi32_si128((uint32_t)(last7 >> 32)));
	v13 = _mm_xor_si128(v13, _mm_slli_si128(mi, 8));
	sipcompress()
	v02 = _mm_xor_si128(v02, mi);
	v02 = _mm_xor_si128(v02, siphash_final.v);
	sipcompress()
	sipcompress()
	sipcompress()

	v02 = _mm_xor_si128(v02, v13);
	v02 = _mm_xor_si128(v02, _mm_shuffle_epi32(v02, _MM_SHUFFLE(1,0,3,2)));
	lo = _mm_cvtsi128_si32(v02);
	hi = _mm_cvtsi128_si32(_mm_srli_si128(v02, 4));
	return ((uint64_t)hi << 32) | lo;
}